

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O2

void t1_builder_add_point(T1_Builder builder,FT_Pos x,FT_Pos y,FT_Byte flag)

{
  short sVar1;
  FT_Outline *pFVar2;
  FT_Vector *pFVar3;
  char *pcVar4;
  FT_Fixed FVar5;
  
  pFVar2 = builder->current;
  if (builder->load_points != '\0') {
    sVar1 = pFVar2->n_points;
    pFVar3 = pFVar2->points;
    pcVar4 = pFVar2->tags;
    FVar5 = FT_RoundFix(x);
    pFVar3[sVar1].x = FVar5 >> 0x10;
    FVar5 = FT_RoundFix(y);
    pFVar3[sVar1].y = FVar5 >> 0x10;
    pcVar4[sVar1] = (flag == '\0') + '\x01';
  }
  pFVar2->n_points = pFVar2->n_points + 1;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  t1_builder_add_point( T1_Builder  builder,
                        FT_Pos      x,
                        FT_Pos      y,
                        FT_Byte     flag )
  {
    FT_Outline*  outline = builder->current;


    if ( builder->load_points )
    {
      FT_Vector*  point   = outline->points + outline->n_points;
      FT_Byte*    control = (FT_Byte*)outline->tags + outline->n_points;


      point->x = FIXED_TO_INT( x );
      point->y = FIXED_TO_INT( y );
      *control = (FT_Byte)( flag ? FT_CURVE_TAG_ON : FT_CURVE_TAG_CUBIC );
    }
    outline->n_points++;
  }